

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxDetector.cpp
# Opt level: O3

void __thiscall
btBoxBoxDetector::getClosestPoints
          (btBoxBoxDetector *this,ClosestPointInput *input,Result *output,btIDebugDraw *param_3,
          bool param_4)

{
  undefined8 uVar1;
  btBoxShape *pbVar2;
  long lVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar4;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  int return_code;
  btScalar depth;
  dMatrix3 R2;
  dMatrix3 R1;
  btVector3 normal;
  dContactGeom *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  float local_d8;
  float fStack_d4;
  int local_c0;
  btScalar local_bc;
  btScalar local_b8 [2];
  btScalar abStack_b0 [10];
  undefined8 local_88;
  undefined4 auStack_80 [10];
  btVector3 local_58;
  btVector3 local_48;
  btVector3 local_38;
  
  lVar3 = 0;
  do {
    *(undefined8 *)((long)auStack_80 + lVar3 + -8) =
         *(undefined8 *)((long)(input->m_transformA).m_basis.m_el[0].m_floats + lVar3);
    *(undefined8 *)((long)abStack_b0 + lVar3 + -8) =
         *(undefined8 *)((long)(input->m_transformB).m_basis.m_el[0].m_floats + lVar3);
    *(undefined4 *)((long)auStack_80 + lVar3) =
         *(undefined4 *)((long)(input->m_transformA).m_basis.m_el[0].m_floats + lVar3 + 8);
    *(undefined4 *)((long)abStack_b0 + lVar3) =
         *(undefined4 *)((long)(input->m_transformB).m_basis.m_el[0].m_floats + lVar3 + 8);
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x30);
  pbVar2 = this->m_box1;
  uVar1 = *(undefined8 *)
           (pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.
           m_implicitShapeDimensions.m_floats;
  fVar4 = (pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[2];
  (*(pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(pbVar2);
  (*(pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(pbVar2);
  (*(pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(pbVar2);
  fVar4 = extraout_XMM0_Da_01 + fVar4;
  local_d8 = (float)uVar1;
  fStack_d4 = (float)((ulong)uVar1 >> 0x20);
  local_48.m_floats[1] = extraout_XMM0_Da_00 + fStack_d4 + extraout_XMM0_Da_00 + fStack_d4;
  local_48.m_floats[0] = extraout_XMM0_Da + local_d8 + extraout_XMM0_Da + local_d8;
  local_48.m_floats[2] = fVar4 + fVar4;
  local_48.m_floats[3] = 0.0;
  pbVar2 = this->m_box2;
  uVar1 = *(undefined8 *)
           (pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.
           m_implicitShapeDimensions.m_floats;
  fVar4 = (pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[2];
  (*(pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(pbVar2);
  (*(pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(pbVar2);
  (*(pbVar2->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(pbVar2);
  fVar4 = extraout_XMM0_Da_04 + fVar4;
  local_d8 = (float)uVar1;
  fStack_d4 = (float)((ulong)uVar1 >> 0x20);
  local_58.m_floats[1] = extraout_XMM0_Da_03 + fStack_d4 + extraout_XMM0_Da_03 + fStack_d4;
  local_58.m_floats[0] = extraout_XMM0_Da_02 + local_d8 + extraout_XMM0_Da_02 + local_d8;
  local_58.m_floats[2] = fVar4 + fVar4;
  local_58.m_floats[3] = 0.0;
  dBoxBox2(&(input->m_transformA).m_origin,(btScalar *)&local_88,&local_48,
           &(input->m_transformB).m_origin,local_b8,&local_58,&local_38,&local_bc,&local_c0,4,
           in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,output);
  return;
}

Assistant:

void	btBoxBoxDetector::getClosestPoints(const ClosestPointInput& input,Result& output,class btIDebugDraw* /*debugDraw*/,bool /*swapResults*/)
{
	
	const btTransform& transformA = input.m_transformA;
	const btTransform& transformB = input.m_transformB;
	
	int skip = 0;
	dContactGeom *contact = 0;

	dMatrix3 R1;
	dMatrix3 R2;

	for (int j=0;j<3;j++)
	{
		R1[0+4*j] = transformA.getBasis()[j].x();
		R2[0+4*j] = transformB.getBasis()[j].x();

		R1[1+4*j] = transformA.getBasis()[j].y();
		R2[1+4*j] = transformB.getBasis()[j].y();


		R1[2+4*j] = transformA.getBasis()[j].z();
		R2[2+4*j] = transformB.getBasis()[j].z();

	}

	

	btVector3 normal;
	btScalar depth;
	int return_code;
	int maxc = 4;


	dBoxBox2 (transformA.getOrigin(), 
	R1,
	2.f*m_box1->getHalfExtentsWithMargin(),
	transformB.getOrigin(),
	R2, 
	2.f*m_box2->getHalfExtentsWithMargin(),
	normal, &depth, &return_code,
	maxc, contact, skip,
	output
	);

}